

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall
ft::list<int,ft::allocator<int>>::unique<ft::equal_to<int>>(list<int,ft::allocator<int>> *this)

{
  undefined1 local_48 [32];
  
  if (1 < *(ulong *)(this + 0x10)) {
    local_48._24_8_ = *(node **)(*(long *)(*(long *)this + 0x10) + 0x10);
    while ((node *)local_48._24_8_ != *(node **)(this + 8)) {
      if (((node *)local_48._24_8_)->data == ((node *)local_48._24_8_)->prev->data) {
        local_48._16_8_ = &PTR__listIterator_0010dd60;
        list<int,_ft::allocator<int>_>::erase
                  ((list<int,_ft::allocator<int>_> *)local_48,(iterator *)this);
        local_48._24_8_ = local_48._8_8_;
      }
      else {
        local_48._24_8_ = ((node *)local_48._24_8_)->next;
      }
    }
  }
  return;
}

Assistant:

void unique(BinaryPredicate binary_pred) {
		if (this->size() <= 1)
			return ;
		iterator	it = this->begin();
		++it;
		while (it != this->end()) {
			iterator	prev = it;
			--prev;
			if (binary_pred(*it, *prev))
				it = this->erase(it);
			else
				++it;
		}
	}